

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.h
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3833::~ChElementShellANCF_3833
          (ChElementShellANCF_3833 *this,void **vtt)

{
  _func_int **pp_Var1;
  double *pdVar2;
  pointer pdVar3;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       pp_Var1;
  this->super_ChLoadableUV = *(ChLoadableUV *)(vtt + 5);
  *(void **)(pp_Var1[-3] +
            (long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                   _vptr_ChElementBase) = vtt[6];
  this->super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 7);
  pdVar2 = (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  if (pdVar2 != (double *)0x0) {
    free((void *)pdVar2[-1]);
  }
  pdVar2 = (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  if (pdVar2 != (double *)0x0) {
    free((void *)pdVar2[-1]);
  }
  pdVar2 = (this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  if (pdVar2 != (double *)0x0) {
    free((void *)pdVar2[-1]);
  }
  pdVar2 = (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  if (pdVar2 != (double *)0x0) {
    free((void *)pdVar2[-1]);
  }
  pdVar2 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  if (pdVar2 != (double *)0x0) {
    free((void *)pdVar2[-1]);
  }
  pdVar2 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_data;
  if (pdVar2 != (double *)0x0) {
    free((void *)pdVar2[-1]);
  }
  pdVar3 = (this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    free((void *)pdVar3[-1]);
  }
  std::
  vector<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
  ::~vector(&this->m_layers);
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
  ::~vector(&this->m_nodes);
  (this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       (_func_int **)&PTR__ChElementGeneric_00b5b728;
  ChKblockGeneric::~ChKblockGeneric(&(this->super_ChElementShell).super_ChElementGeneric.Kmatr);
  return;
}

Assistant:

~ChElementShellANCF_3833() {}